

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

void __thiscall TString::ToUpperCase(TString *this)

{
  char cVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = this->myString[lVar2];
    if (cVar1 == '\0') break;
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      this->myString[lVar2] = cVar1 + -0x20;
    }
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void TString::ToUpperCase(void)
{
	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'a' && *(myString + i) <= 'z')
			*(myString + i) += 'A' - 'a';
}